

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

int Abc_NtkDetectObjClasses_rec
              (Abc_Obj_t *pObj,Vec_Int_t *vMap,Hsh_VecMan_t *pHash,Vec_Int_t *vTemp)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  Vec_Int_t *p;
  int *piVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  size_t __size;
  int *piVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  Vec_Int_t t;
  
  lVar4 = (long)pObj->Id;
  if ((lVar4 < 0) || (vMap->nSize <= pObj->Id)) {
LAB_002a6bd2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar6 = vMap->pArray[lVar4];
  if (uVar6 == 0xffffffff) {
    uVar6 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((7 < uVar6) || ((0xa4U >> uVar6 & 1) == 0)) {
      __assert_fail("Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                    ,0x164,
                    "int Abc_NtkDetectObjClasses_rec(Abc_Obj_t *, Vec_Int_t *, Hsh_VecMan_t *, Vec_Int_t *)"
                   );
    }
    if ((pObj->vFanouts).nSize == 0) {
      vMap->pArray[lVar4] = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = Abc_NtkDetectObjClasses_rec
                        ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray],vMap,pHash
                         ,vTemp);
      iVar7 = (pObj->vFanouts).nSize;
      if (iVar7 == 1) {
        iVar7 = pObj->Id;
        if (((long)iVar7 < 0) || (vMap->nSize <= iVar7)) {
LAB_002a6c8c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vMap->pArray[iVar7] = uVar6;
      }
      else {
        p = (Vec_Int_t *)malloc(0x10);
        p->nCap = 0x10;
        piVar5 = (int *)malloc(0x40);
        p->pArray = piVar5;
        if (((int)uVar6 < 0) || (pHash->vMap->nSize <= (int)uVar6)) goto LAB_002a6bd2;
        iVar3 = pHash->vMap->pArray[uVar6];
        if (((long)iVar3 < 0) || (pHash->vData->nSize <= iVar3)) {
LAB_002a6bf1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar5 = pHash->vData->pArray + iVar3;
        iVar3 = *piVar5;
        (pHash->vTemp).nCap = iVar3;
        (pHash->vTemp).nSize = iVar3;
        (pHash->vTemp).pArray = piVar5 + 2;
        p->nSize = 0;
        if (0 < iVar3) {
          lVar4 = 0;
          do {
            Vec_IntPush(p,(pHash->vTemp).pArray[lVar4]);
            lVar4 = lVar4 + 1;
          } while (lVar4 < (pHash->vTemp).nSize);
          iVar7 = (pObj->vFanouts).nSize;
        }
        if (0 < iVar7) {
          lVar4 = 0;
          do {
            if (lVar4 != 0) {
              uVar6 = Abc_NtkDetectObjClasses_rec
                                ((Abc_Obj_t *)
                                 pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]],vMap,
                                 pHash,vTemp);
              if (((int)uVar6 < 0) || (pHash->vMap->nSize <= (int)uVar6)) goto LAB_002a6bd2;
              iVar7 = pHash->vMap->pArray[uVar6];
              if (((long)iVar7 < 0) || (pHash->vData->nSize <= iVar7)) goto LAB_002a6bf1;
              piVar5 = pHash->vData->pArray + iVar7;
              piVar10 = piVar5 + 2;
              iVar7 = *piVar5;
              (pHash->vTemp).nCap = iVar7;
              (pHash->vTemp).nSize = iVar7;
              (pHash->vTemp).pArray = piVar10;
              iVar3 = p->nSize;
              lVar12 = (long)iVar7 + (long)iVar3;
              piVar5 = vTemp->pArray;
              iVar11 = (int)lVar12;
              if (vTemp->nCap < iVar11) {
                __size = lVar12 * 4;
                if (piVar5 == (int *)0x0) {
                  piVar5 = (int *)malloc(__size);
                }
                else {
                  piVar5 = (int *)realloc(piVar5,__size);
                }
                vTemp->pArray = piVar5;
                if (piVar5 == (int *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                vTemp->nCap = iVar11;
                iVar7 = (pHash->vTemp).nSize;
                piVar10 = (pHash->vTemp).pArray;
              }
              piVar9 = p->pArray;
              piVar1 = piVar9 + iVar3;
              piVar2 = piVar10 + iVar7;
              piVar8 = piVar5;
              if ((0 < iVar3) && (0 < iVar7)) {
                do {
                  iVar7 = *piVar9;
                  iVar3 = *piVar10;
                  if (iVar7 == iVar3) {
                    piVar9 = piVar9 + 1;
                    *piVar8 = iVar7;
                    piVar10 = piVar10 + 1;
                  }
                  else if (iVar7 < iVar3) {
                    piVar9 = piVar9 + 1;
                    *piVar8 = iVar7;
                  }
                  else {
                    piVar10 = piVar10 + 1;
                    *piVar8 = iVar3;
                  }
                  piVar8 = piVar8 + 1;
                } while ((piVar9 < piVar1) && (piVar10 < piVar2));
              }
              for (; piVar9 < piVar1; piVar9 = piVar9 + 1) {
                *piVar8 = *piVar9;
                piVar8 = piVar8 + 1;
              }
              for (; piVar10 < piVar2; piVar10 = piVar10 + 1) {
                *piVar8 = *piVar10;
                piVar8 = piVar8 + 1;
              }
              iVar7 = (int)((ulong)((long)piVar8 - (long)piVar5) >> 2);
              vTemp->nSize = iVar7;
              if (vTemp->nCap < iVar7) {
                __assert_fail("vArr->nSize <= vArr->nCap",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x722,
                              "void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
              }
              if (iVar7 < p->nSize) {
                __assert_fail("vArr->nSize >= vArr1->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x723,
                              "void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
              }
              if (iVar7 < (pHash->vTemp).nSize) {
                __assert_fail("vArr->nSize >= vArr2->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x724,
                              "void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
              }
              iVar3 = p->nCap;
              iVar11 = p->nSize;
              piVar5 = p->pArray;
              iVar7 = vTemp->nSize;
              piVar10 = vTemp->pArray;
              p->nCap = vTemp->nCap;
              p->nSize = iVar7;
              p->pArray = piVar10;
              vTemp->nCap = iVar3;
              vTemp->nSize = iVar11;
              vTemp->pArray = piVar5;
              iVar7 = (pObj->vFanouts).nSize;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < iVar7);
        }
        uVar6 = Hsh_VecManAdd(pHash,p);
        iVar7 = pObj->Id;
        if (((long)iVar7 < 0) || (vMap->nSize <= iVar7)) goto LAB_002a6c8c;
        vMap->pArray[iVar7] = uVar6;
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
        }
        free(p);
      }
    }
  }
  return uVar6;
}

Assistant:

int Abc_NtkDetectObjClasses_rec( Abc_Obj_t * pObj, Vec_Int_t * vMap, Hsh_VecMan_t * pHash, Vec_Int_t * vTemp )
{
    Vec_Int_t * vArray, * vSet;
    Abc_Obj_t * pNext; int i;
    // get the CO set for this object
    int Entry = Vec_IntEntry(vMap, Abc_ObjId(pObj));
    if ( Entry != -1 ) // the set is already computed
        return Entry;
    // compute a new CO set
    assert( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) );
    // if there is no fanouts, the set of COs is empty
    if ( Abc_ObjFanoutNum(pObj) == 0 )
    {
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), 0 );
        return 0;
    }
    // compute the set for the first fanout
    Entry = Abc_NtkDetectObjClasses_rec( Abc_ObjFanout0(pObj), vMap, pHash, vTemp );
    if ( Abc_ObjFanoutNum(pObj) == 1 )
    {
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), Entry );
        return Entry;
    }
    vSet = Vec_IntAlloc( 16 );
    // initialize the set with that of first fanout
    vArray = Hsh_VecReadEntry( pHash, Entry );
    Vec_IntClear( vSet );
    Vec_IntAppend( vSet, vArray );
    // iteratively add sets of other fanouts
    Abc_ObjForEachFanout( pObj, pNext, i )
    {
        if ( i == 0 ) 
            continue;
        Entry = Abc_NtkDetectObjClasses_rec( pNext, vMap, pHash, vTemp );
        vArray = Hsh_VecReadEntry( pHash, Entry );
        Vec_IntTwoMerge2( vSet, vArray, vTemp );
        ABC_SWAP( Vec_Int_t, *vSet, *vTemp );
    }
    // create or find new set and map the object into it
    Entry = Hsh_VecManAdd( pHash, vSet );
    Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), Entry );
    Vec_IntFree( vSet );
    return Entry;
}